

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

bool __thiscall PSBTInput::IsNull(PSBTInput *this)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  bVar3 = false;
  if (((((this->non_witness_utxo).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr == (element_type *)0x0) && ((this->witness_utxo).nValue == -1)) &&
      ((this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
     (((this->unknown)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
      ((this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
    uVar1 = (this->redeem_script).super_CScriptBase._size;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    if (uVar2 == 0) {
      uVar1 = (this->witness_script).super_CScriptBase._size;
      uVar2 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar2 = uVar1;
      }
      bVar3 = uVar2 == 0;
    }
    else {
      bVar3 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool PSBTInput::IsNull() const
{
    return !non_witness_utxo && witness_utxo.IsNull() && partial_sigs.empty() && unknown.empty() && hd_keypaths.empty() && redeem_script.empty() && witness_script.empty();
}